

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O1

void aom_highbd_comp_mask_upsampled_pred
               (MACROBLOCKD *xd,AV1Common *cm,int mi_row,int mi_col,MV *mv,uint8_t *comp_pred8,
               uint8_t *pred8,int width,int height,int subpel_x_q3,int subpel_y_q3,uint8_t *ref8,
               int ref_stride,uint8_t *mask,int mask_stride,int invert_mask,int bd,int subpel_search
               )

{
  aom_highbd_upsampled_pred_sse2
            (xd,cm,mi_row,mi_col,mv,comp_pred8,width,height,subpel_x_q3,subpel_y_q3,ref8,ref_stride,
             bd,subpel_search);
  (*aom_highbd_comp_mask_pred)
            (comp_pred8,pred8,width,height,comp_pred8,width,mask,mask_stride,invert_mask);
  return;
}

Assistant:

void aom_highbd_comp_mask_upsampled_pred(
    MACROBLOCKD *xd, const struct AV1Common *const cm, int mi_row, int mi_col,
    const MV *const mv, uint8_t *comp_pred8, const uint8_t *pred8, int width,
    int height, int subpel_x_q3, int subpel_y_q3, const uint8_t *ref8,
    int ref_stride, const uint8_t *mask, int mask_stride, int invert_mask,
    int bd, int subpel_search) {
  aom_highbd_upsampled_pred(xd, cm, mi_row, mi_col, mv, comp_pred8, width,
                            height, subpel_x_q3, subpel_y_q3, ref8, ref_stride,
                            bd, subpel_search);
  aom_highbd_comp_mask_pred(comp_pred8, pred8, width, height, comp_pred8, width,
                            mask, mask_stride, invert_mask);
}